

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

int Abc_NtkIsTopo(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *p;
  uint uVar3;
  bool bVar4;
  uint local_2c;
  int local_28;
  int Counter;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  local_2c = 0;
  Abc_NtkIncrementTravId(pNtk);
  for (Counter = 0; iVar1 = Abc_NtkCiNum(pNtk), Counter < iVar1; Counter = Counter + 1) {
    pAVar2 = Abc_NtkCi(pNtk,Counter);
    Abc_NodeSetTravIdCurrent(pAVar2);
  }
  Counter = 0;
  do {
    iVar1 = Vec_PtrSize(pNtk->vObjs);
    if (iVar1 <= Counter) {
      if (local_2c != 0) {
        printf("Topological order does not hold for %d internal nodes.\n",(ulong)local_2c);
      }
      return (int)(local_2c == 0);
    }
    pAVar2 = Abc_NtkObj(pNtk,Counter);
    if ((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar2), iVar1 != 0)) {
      for (local_28 = 0; iVar1 = Abc_ObjFaninNum(pAVar2), local_28 < iVar1; local_28 = local_28 + 1)
      {
        p = Abc_ObjFanin(pAVar2,local_28);
        iVar1 = Abc_NodeIsTravIdCurrent(p);
        if (iVar1 == 0) break;
      }
      iVar1 = Abc_ObjFaninNum(pAVar2);
      if ((local_28 != iVar1) &&
         (uVar3 = local_2c + 1, bVar4 = local_2c == 0, local_2c = uVar3, bVar4)) {
        uVar3 = Abc_ObjId(pAVar2);
        printf("Node %d is out of topo order.\n",(ulong)uVar3);
      }
      Abc_NodeSetTravIdCurrent(pAVar2);
    }
    Counter = Counter + 1;
  } while( true );
}

Assistant:

int Abc_NtkIsTopo( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pFanin;
    int i, k, Counter = 0;
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCi( pNtk, pObj, i )
        Abc_NodeSetTravIdCurrent(pObj);
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        // check if fanins are in the topo order
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( !Abc_NodeIsTravIdCurrent(pFanin) )
                break;
        if ( k != Abc_ObjFaninNum(pObj) )
        {
            if ( Counter++ == 0 )
                printf( "Node %d is out of topo order.\n", Abc_ObjId(pObj) );
        }
        Abc_NodeSetTravIdCurrent(pObj);
    }
    if ( Counter )
        printf( "Topological order does not hold for %d internal nodes.\n", Counter );
    return (int)(Counter == 0);
}